

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O2

EStatusCode __thiscall CFFEmbeddedFontWriter::UpdateIndexesAtTopDict(CFFEmbeddedFontWriter *this)

{
  OutputStringBufferStream *this_00;
  CFFPrimitiveWriter *this_01;
  EStatusCode EVar1;
  long lVar2;
  long lVar3;
  
  this_00 = &this->mFontFileStream;
  OutputStringBufferStream::SetPosition(this_00,this->mCharsetPlaceHolderPosition);
  this_01 = &this->mPrimitivesWriter;
  CFFPrimitiveWriter::Write5ByteDictInteger(this_01,this->mCharsetPosition);
  OutputStringBufferStream::SetPosition(this_00,this->mCharstringsPlaceHolderPosition);
  CFFPrimitiveWriter::Write5ByteDictInteger(this_01,this->mCharStringPosition);
  if (((this->mOpenTypeInput).mCFF.mPrivateDicts)->mPrivateDictStart != 0) {
    OutputStringBufferStream::SetPosition(this_00,this->mPrivatePlaceHolderPosition);
    CFFPrimitiveWriter::Write5ByteDictInteger(this_01,this->mPrivateSize);
    CFFPrimitiveWriter::Write5ByteDictInteger(this_01,this->mPrivatePosition);
  }
  if (this->mIsCID == true) {
    OutputStringBufferStream::SetPosition(this_00,this->mFDArrayPlaceHolderPosition);
    CFFPrimitiveWriter::Write5ByteDictInteger(this_01,this->mFDArrayPosition);
    lVar3 = 0x460;
    lVar2 = 0x428;
  }
  else {
    lVar3 = 0x430;
    lVar2 = 0x408;
  }
  OutputStringBufferStream::SetPosition
            (this_00,*(LongFilePositionType *)((long)&(this->mOpenTypeInput).mHeaderOffset + lVar2))
  ;
  CFFPrimitiveWriter::Write5ByteDictInteger
            (this_01,*(long *)((long)&(this->mOpenTypeInput).mHeaderOffset + lVar3));
  EVar1 = CFFPrimitiveWriter::GetInternalState(this_01);
  return EVar1;
}

Assistant:

EStatusCode CFFEmbeddedFontWriter::UpdateIndexesAtTopDict()
{
	mFontFileStream.SetPosition(mCharsetPlaceHolderPosition);
	mPrimitivesWriter.Write5ByteDictInteger((long)mCharsetPosition);

	mFontFileStream.SetPosition(mCharstringsPlaceHolderPosition);
	mPrimitivesWriter.Write5ByteDictInteger((long)mCharStringPosition);

	if(mOpenTypeInput.mCFF.mPrivateDicts[0].mPrivateDictStart != 0)
	{
		mFontFileStream.SetPosition(mPrivatePlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mPrivateSize);
		mPrimitivesWriter.Write5ByteDictInteger((long)mPrivatePosition);
		
	}
	
	if(mIsCID)
	{
		mFontFileStream.SetPosition(mFDArrayPlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mFDArrayPosition);
		mFontFileStream.SetPosition(mFDSelectPlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mFDSelectPosition);
	}
	else
	{
		mFontFileStream.SetPosition(mEncodingPlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mEncodingPosition);
	}

	return mPrimitivesWriter.GetInternalState();
}